

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioStream_LstFuncs.h
# Opt level: O0

UINT8 ADrvLst_Add(ADRV_LIST **headPtr,ADRV_INSTANCE *drvData)

{
  ADRV_LIST *pAVar1;
  ADRV_LIST *local_30;
  ADRV_LIST *curLstItem;
  ADRV_LIST *newLstItem;
  ADRV_INSTANCE *drvData_local;
  ADRV_LIST **headPtr_local;
  
  pAVar1 = ADrvLst_FindItem(*headPtr,drvData,(ADRV_LIST **)0x0);
  if (pAVar1 == (ADRV_LIST *)0x0) {
    pAVar1 = (ADRV_LIST *)malloc(0x10);
    pAVar1->drvInst = drvData;
    pAVar1->next = (ADRV_LIST *)0x0;
    if (*headPtr == (ADRV_LIST *)0x0) {
      *headPtr = pAVar1;
    }
    else {
      for (local_30 = *headPtr; local_30->next != (ADRV_LIST *)0x0; local_30 = local_30->next) {
      }
      local_30->next = pAVar1;
    }
    headPtr_local._7_1_ = '\0';
  }
  else {
    headPtr_local._7_1_ = '\x01';
  }
  return headPtr_local._7_1_;
}

Assistant:

static UINT8 ADrvLst_Add(ADRV_LIST** headPtr, const ADRV_INSTANCE* drvData)
{
	ADRV_LIST* newLstItem;
	ADRV_LIST* curLstItem;
	
	curLstItem = ADrvLst_FindItem(*headPtr, drvData, NULL);
	if (curLstItem != NULL)
		return 0x01;	// already in the list
	
	newLstItem = (ADRV_LIST*)malloc(sizeof(ADRV_LIST));
	newLstItem->drvInst = drvData;
	newLstItem->next = NULL;
	if (*headPtr == NULL)
	{
		*headPtr = newLstItem;
	}
	else
	{
		curLstItem = *headPtr;
		while(curLstItem->next != NULL)
			curLstItem = curLstItem->next;
		curLstItem->next = newLstItem;
	}
	return 0x00;
}